

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void NextContext(CPpmd8 *p)

{
  CPpmd8_Context *pCVar1;
  CTX_PTR c;
  CPpmd8 *p_local;
  
  pCVar1 = (CPpmd8_Context *)
           (p->Base + CONCAT22(p->FoundState->SuccessorHigh,p->FoundState->SuccessorLow));
  if ((p->OrderFall == 0) && ((CPpmd8_Context *)p->UnitsStart <= pCVar1)) {
    p->MaxContext = pCVar1;
    p->MinContext = pCVar1;
  }
  else {
    UpdateModel(p);
    p->MinContext = p->MaxContext;
  }
  return;
}

Assistant:

static void NextContext(CPpmd8 *p)
{
  CTX_PTR c = CTX(SUCCESSOR(p->FoundState));
  if (p->OrderFall == 0 && (Byte *)c >= p->UnitsStart)
    p->MinContext = p->MaxContext = c;
  else
  {
    UpdateModel(p);
    p->MinContext = p->MaxContext;
  }
}